

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall CStorage::AddPath(CStorage *this,char *pPath)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  CStorage *in_RDI;
  CStorage *this_00;
  
  if ((in_RDI->m_NumPaths < 0x10) && (*in_RSI != '\0')) {
    this_00 = in_RDI;
    iVar2 = str_comp(in_RSI,(char *)in_RDI);
    if (iVar2 == 0) {
      if (in_RDI->m_aUserDir[0] != '\0') {
        bVar1 = IsDuplicatePath(this_00,in_RSI);
        if (bVar1) {
          dbg_msg("storage","skipping duplicate path \'$USERDIR\' (\'%s\')",in_RDI->m_aUserDir);
        }
        else {
          in_RDI->m_NumPaths = in_RDI->m_NumPaths + 1;
          str_copy(in_RSI,(char *)in_RDI,0);
          dbg_msg("storage","added path \'$USERDIR\' (\'%s\')",in_RDI->m_aUserDir);
        }
      }
    }
    else {
      iVar2 = str_comp(in_RSI,(char *)in_RDI);
      if (iVar2 == 0) {
        if (in_RDI->m_aDataDir[0] != '\0') {
          bVar1 = IsDuplicatePath(this_00,in_RSI);
          if (bVar1) {
            dbg_msg("storage","skipping duplicate path \'$DATADIR\' (\'%s\')",in_RDI->m_aDataDir);
          }
          else {
            in_RDI->m_NumPaths = in_RDI->m_NumPaths + 1;
            str_copy(in_RSI,(char *)in_RDI,0);
            dbg_msg("storage","added path \'$DATADIR\' (\'%s\')",in_RDI->m_aDataDir);
          }
        }
      }
      else {
        iVar2 = str_comp(in_RSI,(char *)in_RDI);
        if (iVar2 == 0) {
          if (in_RDI->m_aCurrentDir[0] != '\0') {
            bVar1 = IsDuplicatePath(this_00,in_RSI);
            if (bVar1) {
              dbg_msg("storage","skipping duplicate path \'$CURRENTDIR\' (\'%s\')",
                      in_RDI->m_aCurrentDir);
            }
            else {
              in_RDI->m_NumPaths = in_RDI->m_NumPaths + 1;
              str_copy(in_RSI,(char *)in_RDI,0);
              dbg_msg("storage","added path \'$CURRENTDIR\' (\'%s\')",in_RDI->m_aCurrentDir);
            }
          }
        }
        else {
          iVar2 = str_comp(in_RSI,(char *)in_RDI);
          if (iVar2 == 0) {
            if (in_RDI->m_aAppDir[0] != '\0') {
              bVar1 = IsDuplicatePath(this_00,in_RSI);
              if (bVar1) {
                dbg_msg("storage","skipping duplicate path \'$APPDIR\' (\'%s\')",in_RDI->m_aAppDir);
              }
              else {
                in_RDI->m_NumPaths = in_RDI->m_NumPaths + 1;
                str_copy(in_RSI,(char *)in_RDI,0);
                dbg_msg("storage","added path \'$APPDIR\' (\'%s\')",in_RDI->m_aAppDir);
              }
            }
          }
          else {
            iVar2 = fs_is_dir(in_RSI);
            if (iVar2 != 0) {
              bVar1 = IsDuplicatePath(this_00,in_RSI);
              if (bVar1) {
                dbg_msg("storage","skipping duplicate path \'%s\'",in_RSI);
              }
              else {
                in_RDI->m_NumPaths = in_RDI->m_NumPaths + 1;
                str_copy(in_RSI,(char *)in_RDI,0);
                dbg_msg("storage","added path \'%s\'",in_RSI);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AddPath(const char *pPath)
	{
		if(m_NumPaths >= MAX_PATHS || !pPath[0])
			return;

		if(!str_comp(pPath, "$USERDIR"))
		{
			if(m_aUserDir[0])
			{
				if(!IsDuplicatePath(m_aUserDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aUserDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$USERDIR' ('%s')", m_aUserDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$USERDIR' ('%s')", m_aUserDir);
			}
		}
		else if(!str_comp(pPath, "$DATADIR"))
		{
			if(m_aDataDir[0])
			{
				if(!IsDuplicatePath(m_aDataDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aDataDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$DATADIR' ('%s')", m_aDataDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$DATADIR' ('%s')", m_aDataDir);
			}
		}
		else if(!str_comp(pPath, "$CURRENTDIR"))
		{
			if(m_aCurrentDir[0])
			{
				if(!IsDuplicatePath(m_aCurrentDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aCurrentDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$CURRENTDIR' ('%s')", m_aCurrentDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$CURRENTDIR' ('%s')", m_aCurrentDir);
			}
		}
		else if(!str_comp(pPath, "$APPDIR"))
		{
			if(m_aAppDir[0])
			{
				if(!IsDuplicatePath(m_aAppDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aAppDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$APPDIR' ('%s')", m_aAppDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$APPDIR' ('%s')", m_aAppDir);
			}
		}
		else
		{
			if(fs_is_dir(pPath))
			{
				if(!IsDuplicatePath(pPath))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], pPath, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '%s'", pPath);
				}
				else
					dbg_msg("storage", "skipping duplicate path '%s'", pPath);
			}
		}
	}